

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemCopy(Mem *pTo,Mem *pFrom)

{
  u16 uVar1;
  u8 uVar2;
  u8 uVar3;
  int local_1c;
  int rc;
  Mem *pFrom_local;
  Mem *pTo_local;
  
  local_1c = 0;
  if ((pTo->flags & 0x9000) != 0) {
    vdbeMemClearExternAndSetNull(pTo);
  }
  pTo->u = pFrom->u;
  pTo->z = pFrom->z;
  uVar1 = pFrom->flags;
  uVar2 = pFrom->enc;
  uVar3 = pFrom->eSubtype;
  pTo->n = pFrom->n;
  pTo->flags = uVar1;
  pTo->enc = uVar2;
  pTo->eSubtype = uVar3;
  pTo->flags = pTo->flags & 0xefff;
  if (((pTo->flags & 0x12) != 0) && ((pFrom->flags & 0x2000) == 0)) {
    pTo->flags = pTo->flags | 0x4000;
    local_1c = sqlite3VdbeMemMakeWriteable(pTo);
  }
  return local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemCopy(Mem *pTo, const Mem *pFrom){
  int rc = SQLITE_OK;

  assert( !sqlite3VdbeMemIsRowSet(pFrom) );
  if( VdbeMemDynamic(pTo) ) vdbeMemClearExternAndSetNull(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  pTo->flags &= ~MEM_Dyn;
  if( pTo->flags&(MEM_Str|MEM_Blob) ){
    if( 0==(pFrom->flags&MEM_Static) ){
      pTo->flags |= MEM_Ephem;
      rc = sqlite3VdbeMemMakeWriteable(pTo);
    }
  }

  return rc;
}